

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec-group.c
# Opt level: O1

void fec_group_init(fec_group_t *group,uchar fec_k,uchar fec_n,uchar seq,unsigned_long tstamp,
                   unsigned_short fec_len)

{
  uchar *puVar1;
  uint *__s;
  
  if (group == (fec_group_t *)0x0) {
    __assert_fail("group != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",0x19,
                  "void fec_group_init(fec_group_t *, unsigned char, unsigned char, unsigned char, unsigned long, unsigned short)"
                 );
  }
  group->fec_k = fec_k;
  group->fec_n = fec_n;
  group->seq = seq;
  group->tstamp = tstamp;
  group->fec_len = fec_len;
  group->rcvd_pkts = '\0';
  puVar1 = (uchar *)malloc((ulong)fec_len * (ulong)fec_n);
  group->buf = puVar1;
  if (puVar1 != (uchar *)0x0) {
    __s = (uint *)malloc((ulong)((uint)fec_n * 4));
    group->lengths = __s;
    if (__s != (uint *)0x0) {
      if (fec_n != '\0') {
        memset(__s,0,(ulong)fec_n << 2);
      }
      group->decoded = 0;
      return;
    }
    __assert_fail("group->lengths != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",0x25,
                  "void fec_group_init(fec_group_t *, unsigned char, unsigned char, unsigned char, unsigned long, unsigned short)"
                 );
  }
  __assert_fail("group->buf != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",0x23,
                "void fec_group_init(fec_group_t *, unsigned char, unsigned char, unsigned char, unsigned long, unsigned short)"
               );
}

Assistant:

void fec_group_init(fec_group_t *group,
                    unsigned char fec_k,
                    unsigned char fec_n,
                    unsigned char seq,
                    unsigned long tstamp,
                    unsigned short fec_len) {
  assert(group != NULL);
  
  group->fec_k = fec_k;
  group->fec_n = fec_n;
  group->seq = seq;
  group->tstamp = tstamp;
  group->fec_len = fec_len;
  group->rcvd_pkts = 0;

  group->buf = malloc(sizeof(unsigned char) * fec_n * fec_len);
  assert(group->buf != NULL);
  group->lengths = malloc(sizeof(unsigned int) * fec_n);
  assert(group->lengths != NULL);

  /* init pointers */
  int i;
  for (i = 0; i < fec_n; i++) {
    group->lengths[i] = 0;
  }

  group->decoded = 0;
}